

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O2

void __thiscall
QGraphicsItem::installSceneEventFilter(QGraphicsItem *this,QGraphicsItem *filterItem)

{
  QGraphicsScene *pQVar1;
  char *pcVar2;
  long in_FS_OFFSET;
  char local_28 [24];
  char *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = ((this->d_ptr).d)->scene;
  if (pQVar1 == (QGraphicsScene *)0x0) {
    pcVar2 = 
    "QGraphicsItem::installSceneEventFilter: event filters can only be installed on items in a scene."
    ;
  }
  else {
    if (pQVar1 == ((filterItem->d_ptr).d)->scene) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        QGraphicsScenePrivate::installSceneEventFilter
                  (*(QGraphicsScenePrivate **)&pQVar1->field_0x8,this,filterItem);
        return;
      }
      goto LAB_00579d46;
    }
    pcVar2 = 
    "QGraphicsItem::installSceneEventFilter: event filters can only be installed on items in the same scene."
    ;
  }
  local_10 = "default";
  local_28[0x14] = '\0';
  local_28[0x15] = '\0';
  local_28[0x16] = '\0';
  local_28[0x17] = '\0';
  local_28[0xc] = '\0';
  local_28[0xd] = '\0';
  local_28[0xe] = '\0';
  local_28[0xf] = '\0';
  local_28[0x10] = '\0';
  local_28[0x11] = '\0';
  local_28[0x12] = '\0';
  local_28[0x13] = '\0';
  local_28[4] = '\0';
  local_28[5] = '\0';
  local_28[6] = '\0';
  local_28[7] = '\0';
  local_28[8] = '\0';
  local_28[9] = '\0';
  local_28[10] = '\0';
  local_28[0xb] = '\0';
  local_28[0] = '\x02';
  local_28[1] = '\0';
  local_28[2] = '\0';
  local_28[3] = '\0';
  QMessageLogger::warning(local_28,pcVar2);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
LAB_00579d46:
  __stack_chk_fail();
}

Assistant:

void QGraphicsItem::installSceneEventFilter(QGraphicsItem *filterItem)
{
    if (!d_ptr->scene) {
        qWarning("QGraphicsItem::installSceneEventFilter: event filters can only be installed"
                 " on items in a scene.");
        return;
    }
    if (d_ptr->scene != filterItem->scene()) {
        qWarning("QGraphicsItem::installSceneEventFilter: event filters can only be installed"
                 " on items in the same scene.");
        return;
    }
    d_ptr->scene->d_func()->installSceneEventFilter(this, filterItem);
}